

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::ServiceDescriptorProto::MergePartialFromCodedStream
          (ServiceDescriptorProto *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  UnknownFieldSet *unknown_fields;
  string *psVar6;
  MethodDescriptorProto *value;
  ServiceOptions *value_00;
  char cVar7;
  uint tag;
  ulong uVar8;
  
LAB_005d911c:
  pbVar2 = input->buffer_;
  uVar4 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_005d9140;
    input->buffer_ = pbVar2 + 1;
    uVar8 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_005d9140:
    uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
    uVar8 = 0;
    if (uVar4 - 1 < 0x7f) {
      uVar8 = 0x100000000;
    }
    uVar8 = uVar4 | uVar8;
  }
  tag = (uint)uVar8;
  if ((uVar8 & 0x100000000) != 0) {
    uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
    cVar7 = (char)uVar8;
    if (uVar5 == 3) {
      if (cVar7 != '\x1a') goto LAB_005d9162;
      value_00 = mutable_options(this);
      bVar3 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::ServiceOptions>
                        (input,value_00);
      goto LAB_005d9192;
    }
    if (uVar5 == 2) {
      if (cVar7 == '\x12') {
        value = RepeatedPtrField<google::protobuf::MethodDescriptorProto>::Add(&this->method_);
        bVar3 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::MethodDescriptorProto>(input,value);
        goto LAB_005d9192;
      }
      goto LAB_005d9162;
    }
    if ((uVar5 == 1) && (cVar7 == '\n')) {
      psVar6 = mutable_name_abi_cxx11_(this);
      bVar3 = internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar3) {
        return false;
      }
      psVar6 = (this->name_).ptr_;
      internal::WireFormatLite::VerifyUtf8String
                ((psVar6->_M_dataplus)._M_p,(int)psVar6->_M_string_length,PARSE,
                 "google.protobuf.ServiceDescriptorProto.name");
      goto LAB_005d911c;
    }
  }
LAB_005d9162:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  unknown_fields = mutable_unknown_fields(this);
  bVar3 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_005d9192:
  if (bVar3 == false) {
    return false;
  }
  goto LAB_005d911c;
}

Assistant:

bool ServiceDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.ServiceDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.ServiceDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.MethodDescriptorProto method = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_method()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.ServiceOptions options = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.ServiceDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.ServiceDescriptorProto)
  return false;
#undef DO_
}